

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O3

VOID GetSystemTimeAsFileTime(LPFILETIME lpSystemTimeAsFileTime)

{
  int iVar1;
  _FILETIME _Var2;
  undefined1 local_30 [8];
  timeval Time;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001278c1;
      _Var2 = (_FILETIME)
              ((long)local_30 * 10000000 + 0x19db1ded53e8000 + (Time.tv_sec * 1000) / 100);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetSystemTimeAsFileTime",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/filetime.cpp"
              ,0x204);
      fprintf(_stderr,"gettimeofday() failed");
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001278c1;
      _Var2.dwLowDateTime = 0xd53e8000;
      _Var2.dwHighDateTime = 0x19db1de;
    }
    *lpSystemTimeAsFileTime = _Var2;
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
LAB_001278c1:
  abort();
}

Assistant:

VOID
PALAPI
GetSystemTimeAsFileTime(
            OUT LPFILETIME lpSystemTimeAsFileTime)
{
    struct timeval Time;

    PERF_ENTRY(GetSystemTimeAsFileTime);
    ENTRY("GetSystemTimeAsFileTime(lpSystemTimeAsFileTime=%p)\n", 
          lpSystemTimeAsFileTime);

    if ( gettimeofday( &Time, NULL ) != 0 )
    {
        ASSERT("gettimeofday() failed");
        /* no way to indicate failure, so set time to zero */
        *lpSystemTimeAsFileTime = FILEUnixTimeToFileTime( 0, 0 );
    }
    else
    {
        /* use (tv_usec * 1000) because 2nd arg is in nanoseconds */
        *lpSystemTimeAsFileTime = FILEUnixTimeToFileTime( Time.tv_sec,
                                                          Time.tv_usec * 1000 );
    }

    LOGEXIT("GetSystemTimeAsFileTime returns.\n");
    PERF_EXIT(GetSystemTimeAsFileTime);
}